

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::nonfinite_writer<wchar_t>::operator()
          (nonfinite_writer<wchar_t> *this,wchar_t **it)

{
  char cVar1;
  int *piVar2;
  wchar_t *pwVar3;
  long *in_RSI;
  uint *in_RDI;
  
  if (*in_RDI != 0) {
    cVar1 = *(char *)((long)&basic_data<void>::signs + (ulong)*in_RDI);
    piVar2 = (int *)*in_RSI;
    *in_RSI = (long)(piVar2 + 1);
    *piVar2 = (int)cVar1;
  }
  pwVar3 = copy_str<wchar_t,_const_char_*,_wchar_t_*,_0>
                     ((char *)in_RSI,(char *)in_RDI,(wchar_t *)0x20e700);
  *in_RSI = (long)pwVar3;
  return;
}

Assistant:

void operator()(It&& it) const {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    it = copy_str<Char>(str, str + str_size, it);
  }